

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
DecodeConnectivity(MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                   *this)

{
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *this_00;
  int64_t *piVar1;
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  *this_01;
  MeshEdgebreakerTraversalPredictiveDecoder *this_02;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  MeshEdgebreakerDecoder *pMVar6;
  DecoderBuffer *pDVar7;
  pointer piVar8;
  pointer pTVar9;
  pointer pHVar10;
  pointer pIVar11;
  uint *puVar12;
  uint uVar13;
  bool bVar14;
  ushort uVar15;
  int32_t iVar16;
  int iVar17;
  int iVar18;
  CornerTable *pCVar19;
  undefined4 extraout_var;
  pointer pAVar20;
  ulong uVar21;
  ulong uVar22;
  uint *puVar23;
  int iVar24;
  CornerIndex CVar25;
  long lVar26;
  pointer __p;
  uint32_t encoded_connectivity_size;
  uint32_t num_encoded_split_symbols;
  uint32_t num_encoded_symbols;
  uint32_t num_faces;
  uint32_t num_encoded_vertices;
  DecoderBuffer traversal_end_buffer;
  int local_90;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  DecoderBuffer local_68;
  
  this->num_new_vertices_ = 0;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->new_to_parent_vertex_map_)._M_h);
  pMVar6 = this->decoder_;
  uVar3._0_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar3._1_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  uVar3._2_2_ = *(undefined2 *)&(pMVar6->super_MeshDecoder).super_PointCloudDecoder.field_0x4a;
  if (((uint)(pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_minor_ |
      (uVar3 & 0xff) << 8) < 0x202) {
    pDVar7 = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    if ((byte)(undefined1)uVar3 < 2) {
      lVar26 = pDVar7->pos_ + 4;
      if (pDVar7->data_size_ < lVar26) {
        return false;
      }
      local_68.data_ =
           (char *)CONCAT44(local_68.data_._4_4_,*(undefined4 *)(pDVar7->data_ + pDVar7->pos_));
      pDVar7->pos_ = lVar26;
    }
    else {
      bVar14 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,(uint *)&local_68,pDVar7);
      if (!bVar14) {
        return false;
      }
    }
    this->num_new_vertices_ = (int)local_68.data_;
  }
  pDVar7 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
    lVar26 = pDVar7->pos_ + 4;
    if (pDVar7->data_size_ < lVar26) {
      return false;
    }
    local_6c = *(uint *)(pDVar7->data_ + pDVar7->pos_);
    pDVar7->pos_ = lVar26;
  }
  else {
    bVar14 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_6c,pDVar7);
    if (!bVar14) {
      return false;
    }
  }
  this->num_encoded_vertices_ = local_6c;
  pDVar7 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
    lVar26 = pDVar7->pos_ + 4;
    if (pDVar7->data_size_ < lVar26) {
      return false;
    }
    local_70 = *(uint *)(pDVar7->data_ + pDVar7->pos_);
    pDVar7->pos_ = lVar26;
  }
  else {
    bVar14 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_70,pDVar7);
    if (!bVar14) {
      return false;
    }
  }
  uVar3 = local_70;
  uVar22 = (ulong)local_70;
  if (0x55555555 < uVar22) {
    return false;
  }
  uVar4 = this->num_encoded_vertices_;
  if (local_70 * 3 < uVar4) {
    return false;
  }
  if ((ulong)(((long)(int)uVar4 + -1) * (long)(int)uVar4) >> 1 < (ulong)(local_70 * 3 >> 1)) {
    return false;
  }
  pMVar6 = this->decoder_;
  pDVar7 = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  lVar26 = pDVar7->pos_ + 1;
  if (pDVar7->data_size_ < lVar26) {
    return false;
  }
  bVar2 = pDVar7->data_[pDVar7->pos_];
  pDVar7->pos_ = lVar26;
  if ((pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
    lVar26 = pDVar7->pos_ + 4;
    if (pDVar7->data_size_ < lVar26) {
      return false;
    }
    local_74 = *(uint *)(pDVar7->data_ + pDVar7->pos_);
    pDVar7->pos_ = lVar26;
  }
  else {
    bVar14 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_74,pDVar7);
    if (!bVar14) {
      return false;
    }
  }
  uVar4 = local_74;
  if (uVar3 < local_74) {
    return false;
  }
  if ((uint)((ulong)local_74 * 0x2aaaaaaab >> 0x21) < uVar3) {
    return false;
  }
  pDVar7 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
    lVar26 = pDVar7->pos_ + 4;
    if (pDVar7->data_size_ < lVar26) {
      return false;
    }
    local_78 = *(uint *)(pDVar7->data_ + pDVar7->pos_);
    pDVar7->pos_ = lVar26;
  }
  else {
    bVar14 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_78,pDVar7);
    if (!bVar14) {
      return false;
    }
  }
  uVar13 = local_78;
  if (uVar4 < local_78) {
    return false;
  }
  piVar8 = (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar8;
  }
  pCVar19 = (CornerTable *)operator_new(0xa8);
  CornerTable::CornerTable(pCVar19);
  this_00 = &this->corner_table_;
  local_68.data_ = (char *)0x0;
  std::__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::reset
            ((__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             this_00,pCVar19);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)&local_68);
  if ((this->corner_table_)._M_t.
      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
      super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl == (CornerTable *)0x0) {
    return false;
  }
  piVar8 = (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar8;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->processed_corner_ids_,uVar22);
  piVar8 = (this->processed_connectivity_corners_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->processed_connectivity_corners_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    (this->processed_connectivity_corners_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar8;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->processed_connectivity_corners_,uVar22);
  pTVar9 = (this->topology_split_data_).
           super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->topology_split_data_).
      super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar9) {
    (this->topology_split_data_).
    super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar9;
  }
  pHVar10 = (this->hole_event_data_).
            super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->hole_event_data_).
      super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
      super__Vector_impl_data._M_finish != pHVar10) {
    (this->hole_event_data_).
    super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>._M_impl.
    super__Vector_impl_data._M_finish = pHVar10;
  }
  pIVar11 = (this->init_corners_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  if ((this->init_corners_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar11) {
    (this->init_corners_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar11;
  }
  this->last_symbol_id_ = -1;
  this->last_vert_id_ = -1;
  this->last_face_id_ = -1;
  this_01 = &this->attribute_data_;
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ::_M_erase_at_end(this_01,(this->attribute_data_).
                            super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  ::resize(this_01,(ulong)bVar2);
  bVar14 = CornerTable::Reset((this->corner_table_)._M_t.
                              super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                              .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,uVar3
                              ,this->num_encoded_vertices_ + uVar13);
  if (!bVar14) {
    return false;
  }
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            (&this->is_vert_hole_,(ulong)(this->num_encoded_vertices_ + uVar13),true);
  pMVar6 = this->decoder_;
  uVar5._0_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar5._1_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  uVar5._2_2_ = *(undefined2 *)&(pMVar6->super_MeshDecoder).super_PointCloudDecoder.field_0x4a;
  if (0x201 < ((uint)(pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_minor_ |
              (uVar5 & 0xff) << 8)) {
    iVar16 = DecodeHoleAndTopologySplitEvents
                       (this,(pMVar6->super_MeshDecoder).super_PointCloudDecoder.buffer_);
    local_90 = -1;
    if (iVar16 == -1) {
      return false;
    }
    goto LAB_0012cfb7;
  }
  pDVar7 = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((byte)(undefined1)uVar5 < 2) {
    lVar26 = pDVar7->pos_ + 4;
    if (pDVar7->data_size_ < lVar26) goto LAB_0012cfab;
    local_7c = *(uint *)(pDVar7->data_ + pDVar7->pos_);
    pDVar7->pos_ = lVar26;
LAB_0012cf24:
    uVar22 = (ulong)local_7c;
    if ((uVar22 == 0) ||
       (pDVar7 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_,
       pDVar7->data_size_ - pDVar7->pos_ < (long)uVar22)) goto LAB_0012cfab;
    DecoderBuffer::DecoderBuffer(&local_68);
    pDVar7 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    lVar26 = uVar22 + pDVar7->pos_;
    DecoderBuffer::Init(&local_68,pDVar7->data_ + lVar26,pDVar7->data_size_ - lVar26,
                        pDVar7->bitstream_version_);
    local_90 = DecodeHoleAndTopologySplitEvents(this,&local_68);
    bVar14 = local_90 != -1;
    DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
  }
  else {
    bVar14 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_7c,pDVar7);
    if (bVar14) goto LAB_0012cf24;
LAB_0012cfab:
    local_90 = -1;
    bVar14 = false;
  }
  if (!bVar14) {
    return false;
  }
LAB_0012cfb7:
  this_02 = &this->traversal_decoder_;
  MeshEdgebreakerTraversalDecoder::Init
            (&this_02->super_MeshEdgebreakerTraversalDecoder,
             &this->super_MeshEdgebreakerDecoderImplInterface);
  iVar17 = (*(this->super_MeshEdgebreakerDecoderImplInterface).
             _vptr_MeshEdgebreakerDecoderImplInterface[9])(this);
  (this->traversal_decoder_).corner_table_ = (CornerTable *)CONCAT44(extraout_var,iVar17);
  (this->traversal_decoder_).num_vertices_ = uVar13 + this->num_encoded_vertices_;
  (this->traversal_decoder_).super_MeshEdgebreakerTraversalDecoder.num_attribute_data_ = (uint)bVar2
  ;
  DecoderBuffer::DecoderBuffer(&local_68);
  bVar14 = MeshEdgebreakerTraversalPredictiveDecoder::Start(this_02,&local_68);
  if ((bVar14) && (iVar17 = DecodeConnectivity(this,uVar4), iVar17 != -1)) {
    pDVar7 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    DecoderBuffer::Init(pDVar7,local_68.data_ + local_68.pos_,local_68.data_size_ - local_68.pos_,
                        pDVar7->bitstream_version_);
    pMVar6 = this->decoder_;
    uVar15._0_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    uVar15._1_1_ = (pMVar6->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
    uVar15 = uVar15 << 8 | uVar15 >> 8;
    if (uVar15 < 0x202) {
      piVar1 = &((pMVar6->super_MeshDecoder).super_PointCloudDecoder.buffer_)->pos_;
      *piVar1 = *piVar1 + (long)local_90;
    }
    if ((this->attribute_data_).
        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->attribute_data_).
        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar19 = (this_00->_M_t).
                super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
                _M_t.
                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
      iVar24 = (int)((ulong)((long)(pCVar19->corner_to_vertex_map_).vector_.
                                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&(pCVar19->corner_to_vertex_map_).vector_) >> 2);
      if (uVar15 < 0x201) {
        if (iVar24 != 0) {
          CVar25.value_ = 0;
          do {
            bVar14 = DecodeAttributeConnectivitiesOnFaceLegacy(this,CVar25);
            if (!bVar14) goto LAB_0012d275;
            CVar25.value_ = CVar25.value_ + 3;
            pCVar19 = (this_00->_M_t).
                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                      .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
          } while (CVar25.value_ <
                   (uint)((ulong)((long)(pCVar19->corner_to_vertex_map_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 *(long *)&(pCVar19->corner_to_vertex_map_).vector_) >> 2));
        }
      }
      else if (iVar24 != 0) {
        CVar25.value_ = 0;
        do {
          bVar14 = DecodeAttributeConnectivitiesOnFace(this,CVar25);
          if (!bVar14) goto LAB_0012d275;
          CVar25.value_ = CVar25.value_ + 3;
          pCVar19 = (this_00->_M_t).
                    super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        } while (CVar25.value_ <
                 (uint)((ulong)((long)(pCVar19->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               *(long *)&(pCVar19->corner_to_vertex_map_).vector_) >> 2));
      }
    }
    MeshEdgebreakerTraversalDecoder::Done(&this_02->super_MeshEdgebreakerTraversalDecoder);
    pAVar20 = (this->attribute_data_).
              super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->attribute_data_).
        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar20) {
      uVar22 = 0;
      do {
        MeshAttributeCornerTable::InitEmpty
                  (&pAVar20[uVar22].connectivity_data,
                   (this_00->_M_t).
                   super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                   .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
        pAVar20 = (this_01->
                  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        puVar12 = (uint *)pAVar20[uVar22].attribute_seam_corners.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
        for (puVar23 = *(uint **)&pAVar20[uVar22].attribute_seam_corners.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl;
            puVar23 != puVar12; puVar23 = puVar23 + 1) {
          MeshAttributeCornerTable::AddSeamEdge
                    (&(this_01->
                      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar22].connectivity_data,
                     (CornerIndex)*puVar23);
        }
        bVar14 = MeshAttributeCornerTable::RecomputeVertices
                           (&(this_01->
                             super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar22].connectivity_data,
                            (Mesh *)0x0,(PointAttribute *)0x0);
        if (!bVar14) goto LAB_0012d275;
        uVar22 = (ulong)((int)uVar22 + 1);
        pAVar20 = (this->attribute_data_).
                  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar21 = ((long)(this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar20 >> 6) *
                 -0x3333333333333333;
      } while (uVar22 <= uVar21 && uVar21 - uVar22 != 0);
    }
    pCVar19 = (this->corner_table_)._M_t.
              super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
              _M_t.
              super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
              .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    MeshAttributeIndicesEncodingData::Init
              (&this->pos_encoding_data_,
               (int)((ulong)((long)(pCVar19->vertex_corners_).vector_.
                                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            *(long *)&(pCVar19->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            ) >> 2));
    pAVar20 = (this->attribute_data_).
              super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->attribute_data_).
        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar20) {
      uVar22 = 0;
      uVar21 = 1;
      do {
        pCVar19 = (this_00->_M_t).
                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        iVar18 = (int)((ulong)((long)pAVar20[uVar22].connectivity_data.
                                     vertex_to_attribute_entry_id_map_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)pAVar20[uVar22].connectivity_data.
                                    vertex_to_attribute_entry_id_map_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
        iVar24 = (int)((ulong)((long)(pCVar19->vertex_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&(pCVar19->vertex_corners_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              ) >> 2);
        if (iVar24 < iVar18) {
          iVar24 = iVar18;
        }
        MeshAttributeIndicesEncodingData::Init(&pAVar20[uVar22].encoding_data,iVar24);
        pAVar20 = (this->attribute_data_).
                  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = ((long)(this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar20 >> 6) *
                 -0x3333333333333333;
        bVar14 = uVar21 <= uVar22;
        lVar26 = uVar22 - uVar21;
        uVar22 = uVar21;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (bVar14 && lVar26 != 0);
    }
    bVar14 = AssignPointsToCorners(this,iVar17);
  }
  else {
LAB_0012d275:
    bVar14 = false;
  }
  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
  return bVar14;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeConnectivity() {
  num_new_vertices_ = 0;
  new_to_parent_vertex_map_.clear();
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t num_new_verts;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&num_new_verts)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&num_new_verts, decoder_->buffer())) {
        return false;
      }
    }
    num_new_vertices_ = num_new_verts;
  }
#endif

  uint32_t num_encoded_vertices;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_vertices)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_vertices, decoder_->buffer())) {
      return false;
    }
  }
  num_encoded_vertices_ = num_encoded_vertices;

  uint32_t num_faces;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_faces)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, decoder_->buffer())) {
      return false;
    }
  }
  if (num_faces > std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;  // Draco cannot handle this many faces.
  }

  if (static_cast<uint32_t>(num_encoded_vertices_) > num_faces * 3) {
    return false;  // There cannot be more vertices than 3 * num_faces.
  }

  // Minimum number of edges of the mesh assuming each edge is shared between
  // two faces.
  const uint32_t min_num_face_edges = 3 * num_faces / 2;

  // Maximum number of edges that can exist between |num_encoded_vertices_|.
  // This is based on graph theory assuming simple connected graph.
  const uint64_t num_encoded_vertices_64 =
      static_cast<uint64_t>(num_encoded_vertices_);
  const uint64_t max_num_vertex_edges =
      num_encoded_vertices_64 * (num_encoded_vertices_64 - 1) / 2;
  if (max_num_vertex_edges < min_num_face_edges) {
    // It is impossible to construct a manifold mesh with these properties.
    return false;
  }

  uint8_t num_attribute_data;
  if (!decoder_->buffer()->Decode(&num_attribute_data)) {
    return false;
  }

  uint32_t num_encoded_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_faces < num_encoded_symbols) {
    // Number of faces needs to be the same or greater than the number of
    // symbols (it can be greater because the initial face may not be encoded as
    // a symbol).
    return false;
  }
  const uint32_t max_encoded_faces =
      num_encoded_symbols + (num_encoded_symbols / 3);
  if (num_faces > max_encoded_faces) {
    // Faces can only be 1 1/3 times bigger than number of encoded symbols. This
    // could only happen if all new encoded components started with interior
    // triangles. E.g. A mesh with multiple tetrahedrons.
    return false;
  }

  uint32_t num_encoded_split_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_split_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_split_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_encoded_split_symbols > num_encoded_symbols) {
    return false;  // Split symbols are a sub-set of all symbols.
  }

  // Decode topology (connectivity).
  vertex_traversal_length_.clear();
  corner_table_ = std::unique_ptr<CornerTable>(new CornerTable());
  if (corner_table_ == nullptr) {
    return false;
  }
  processed_corner_ids_.clear();
  processed_corner_ids_.reserve(num_faces);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(num_faces);
  topology_split_data_.clear();
  hole_event_data_.clear();
  init_face_configurations_.clear();
  init_corners_.clear();

  last_symbol_id_ = -1;
  last_face_id_ = -1;
  last_vert_id_ = -1;

  attribute_data_.clear();
  // Add one attribute data for each attribute decoder.
  attribute_data_.resize(num_attribute_data);

  if (!corner_table_->Reset(
          num_faces, num_encoded_vertices_ + num_encoded_split_symbols)) {
    return false;
  }

  // Start with all vertices marked as holes (boundaries).
  // Only vertices decoded with TOPOLOGY_C symbol (and the initial face) will
  // be marked as non hole vertices. We need to allocate the array larger
  // because split symbols can create extra vertices during the decoding
  // process (these extra vertices are then eliminated during deduplication).
  is_vert_hole_.assign(num_encoded_vertices_ + num_encoded_split_symbols, true);

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  int32_t topology_split_decoded_bytes = -1;
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t encoded_connectivity_size;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&encoded_connectivity_size)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&encoded_connectivity_size, decoder_->buffer())) {
        return false;
      }
    }
    if (encoded_connectivity_size == 0 ||
        encoded_connectivity_size > decoder_->buffer()->remaining_size()) {
      return false;
    }
    DecoderBuffer event_buffer;
    event_buffer.Init(
        decoder_->buffer()->data_head() + encoded_connectivity_size,
        decoder_->buffer()->remaining_size() - encoded_connectivity_size,
        decoder_->buffer()->bitstream_version());
    // Decode hole and topology split events.
    topology_split_decoded_bytes =
        DecodeHoleAndTopologySplitEvents(&event_buffer);
    if (topology_split_decoded_bytes == -1) {
      return false;
    }

  } else
#endif
  {
    if (DecodeHoleAndTopologySplitEvents(decoder_->buffer()) == -1) {
      return false;
    }
  }

  traversal_decoder_.Init(this);
  // Add one extra vertex for each split symbol.
  traversal_decoder_.SetNumEncodedVertices(num_encoded_vertices_ +
                                           num_encoded_split_symbols);
  traversal_decoder_.SetNumAttributeData(num_attribute_data);

  DecoderBuffer traversal_end_buffer;
  if (!traversal_decoder_.Start(&traversal_end_buffer)) {
    return false;
  }

  const int num_connectivity_verts = DecodeConnectivity(num_encoded_symbols);
  if (num_connectivity_verts == -1) {
    return false;
  }

  // Set the main buffer to the end of the traversal.
  decoder_->buffer()->Init(traversal_end_buffer.data_head(),
                           traversal_end_buffer.remaining_size(),
                           decoder_->buffer()->bitstream_version());

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Skip topology split data that was already decoded earlier.
    decoder_->buffer()->Advance(topology_split_decoded_bytes);
  }
#endif

  // Decode connectivity of non-position attributes.
  if (!attribute_data_.empty()) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFaceLegacy(ci)) {
          return false;
        }
      }

    } else
#endif
    {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFace(ci)) {
          return false;
        }
      }
    }
  }
  traversal_decoder_.Done();

  // Decode attribute connectivity.
  // Prepare data structure for decoding non-position attribute connectivity.
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    attribute_data_[i].connectivity_data.InitEmpty(corner_table_.get());
    // Add all seams.
    for (int32_t c : attribute_data_[i].attribute_seam_corners) {
      attribute_data_[i].connectivity_data.AddSeamEdge(CornerIndex(c));
    }
    // Recompute vertices from the newly added seam edges.
    if (!attribute_data_[i].connectivity_data.RecomputeVertices(nullptr,
                                                                nullptr)) {
      return false;
    }
  }

  pos_encoding_data_.Init(corner_table_->num_vertices());
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    // For non-position attributes, preallocate the vertex to value mapping
    // using the maximum number of vertices from the base corner table and the
    // attribute corner table (since the attribute decoder may use either of
    // it).
    int32_t att_connectivity_verts =
        attribute_data_[i].connectivity_data.num_vertices();
    if (att_connectivity_verts < corner_table_->num_vertices()) {
      att_connectivity_verts = corner_table_->num_vertices();
    }
    attribute_data_[i].encoding_data.Init(att_connectivity_verts);
  }
  if (!AssignPointsToCorners(num_connectivity_verts)) {
    return false;
  }
  return true;
}